

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

int If_CluCheckExt3(void *pMan,word *pTruth,int nVars,int nLutLeaf,int nLutLeaf2,int nLutRoot,
                   char *pLut0,char *pLut1,char *pLut2,word *pFunc0,word *pFunc1,word *pFunc2)

{
  If_Grp_t local_90;
  undefined1 local_7e [8];
  If_Grp_t R;
  If_Grp_t G2;
  If_Grp_t G;
  If_Man_t *p;
  int nLutRoot_local;
  int nLutLeaf2_local;
  int nLutLeaf_local;
  int nVars_local;
  word *pTruth_local;
  void *pMan_local;
  
  If_CluCheck3(&local_90,(If_Man_t *)pMan,pTruth,nVars,nLutLeaf,nLutLeaf2,nLutRoot,
               (If_Grp_t *)local_7e,(If_Grp_t *)(R.pVars + 8),pFunc0,pFunc1,pFunc2);
  *(undefined1 (*) [8])pLut0 = local_7e;
  pLut0[8] = R.nVars;
  pLut0[9] = R.nMyu;
  pLut0[10] = R.pVars[0];
  pLut0[0xb] = R.pVars[1];
  pLut0[0xc] = R.pVars[2];
  pLut0[0xd] = R.pVars[3];
  pLut0[0xe] = R.pVars[4];
  pLut0[0xf] = R.pVars[5];
  *(undefined2 *)(pLut0 + 0x10) = R.pVars._6_2_;
  pLut1[0] = local_90.nVars;
  pLut1[1] = local_90.nMyu;
  pLut1[2] = local_90.pVars[0];
  pLut1[3] = local_90.pVars[1];
  pLut1[4] = local_90.pVars[2];
  pLut1[5] = local_90.pVars[3];
  pLut1[6] = local_90.pVars[4];
  pLut1[7] = local_90.pVars[5];
  *(undefined8 *)(pLut1 + 8) = local_90.pVars._6_8_;
  *(undefined2 *)(pLut1 + 0x10) = local_90.pVars._14_2_;
  *(undefined8 *)pLut2 = R.pVars._8_8_;
  pLut2[8] = G2.nVars;
  pLut2[9] = G2.nMyu;
  pLut2[10] = G2.pVars[0];
  pLut2[0xb] = G2.pVars[1];
  pLut2[0xc] = G2.pVars[2];
  pLut2[0xd] = G2.pVars[3];
  pLut2[0xe] = G2.pVars[4];
  pLut2[0xf] = G2.pVars[5];
  *(undefined2 *)(pLut2 + 0x10) = G2.pVars._6_2_;
  G2.pVars[8] = local_90.nVars;
  return (int)('\0' < G2.pVars[8]);
}

Assistant:

int If_CluCheckExt3( void * pMan, word * pTruth, int nVars, int nLutLeaf, int nLutLeaf2, int nLutRoot, 
                    char * pLut0, char * pLut1, char * pLut2, word * pFunc0, word * pFunc1, word * pFunc2 )
{
    If_Man_t * p = (If_Man_t *)pMan;
    If_Grp_t G, G2, R;
    G = If_CluCheck3( p, pTruth, nVars, nLutLeaf, nLutLeaf2, nLutRoot, &R, &G2, pFunc0, pFunc1, pFunc2 );
    memcpy( pLut0, &R, sizeof(If_Grp_t) );
    memcpy( pLut1, &G, sizeof(If_Grp_t) );
    memcpy( pLut2, &G2, sizeof(If_Grp_t) );
    return (G.nVars > 0);
}